

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_map_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MapFieldGenerator::GenerateSerializeWithCachedSizesToArray
          (MapFieldGenerator *this,Printer *printer)

{
  Type TVar1;
  Descriptor *pDVar2;
  FieldDescriptor *pFVar3;
  bool string_key_00;
  bool string_value_00;
  allocator local_b9;
  undefined1 local_b8 [4];
  bool utf8_check;
  bool string_value;
  bool string_key;
  FieldDescriptor *local_98;
  FieldDescriptor *value_field;
  string local_88;
  FieldDescriptor *local_68;
  FieldDescriptor *key_field;
  undefined1 local_50 [8];
  Formatter format;
  Printer *printer_local;
  MapFieldGenerator *this_local;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  Formatter::Formatter((Formatter *)local_50,printer,&(this->super_FieldGenerator).variables_);
  Formatter::operator()<>((Formatter *)local_50,"if (!this->_internal_$name$().empty()) {\n");
  Formatter::Indent((Formatter *)local_50);
  pDVar2 = FieldDescriptor::message_type((this->super_FieldGenerator).descriptor_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_88,"key",(allocator *)((long)&value_field + 7));
  pFVar3 = Descriptor::FindFieldByName(pDVar2,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator((allocator<char> *)((long)&value_field + 7));
  local_68 = pFVar3;
  pDVar2 = FieldDescriptor::message_type((this->super_FieldGenerator).descriptor_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_b8,"value",&local_b9);
  pFVar3 = Descriptor::FindFieldByName(pDVar2,(ConstStringParam)local_b8);
  std::__cxx11::string::~string((string *)local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  local_98 = pFVar3;
  TVar1 = FieldDescriptor::type(local_68);
  string_key_00 = TVar1 == TYPE_STRING;
  TVar1 = FieldDescriptor::type(local_98);
  string_value_00 = TVar1 == TYPE_STRING;
  Formatter::operator()<>
            ((Formatter *)local_50,
             "typedef ::$proto_ns$::Map< $key_cpp$, $val_cpp$ >::const_pointer\n    ConstPtr;\n");
  if (string_key_00) {
    Formatter::operator()<>
              ((Formatter *)local_50,
               "typedef ConstPtr SortItem;\ntypedef ::$proto_ns$::internal::CompareByDerefFirst<SortItem> Less;\n"
              );
  }
  else {
    Formatter::operator()<>
              ((Formatter *)local_50,
               "typedef ::$proto_ns$::internal::SortItem< $key_cpp$, ConstPtr > SortItem;\ntypedef ::$proto_ns$::internal::CompareByFirstField<SortItem> Less;\n"
              );
  }
  if (string_key_00 || string_value_00) {
    Formatter::operator()<>
              ((Formatter *)local_50,
               "struct Utf8Check {\n  static void Check(ConstPtr p) {\n    (void)p;\n");
    Formatter::Indent((Formatter *)local_50);
    Formatter::Indent((Formatter *)local_50);
    if (string_key_00) {
      GenerateUtf8CheckCodeForString
                (local_68,(this->super_FieldGenerator).options_,false,
                 "p->first.data(), static_cast<int>(p->first.length()),\n",(Formatter *)local_50);
    }
    if (string_value_00) {
      GenerateUtf8CheckCodeForString
                (local_98,(this->super_FieldGenerator).options_,false,
                 "p->second.data(), static_cast<int>(p->second.length()),\n",(Formatter *)local_50);
    }
    Formatter::Outdent((Formatter *)local_50);
    Formatter::Outdent((Formatter *)local_50);
    Formatter::operator()<>((Formatter *)local_50,"  }\n};\n");
  }
  Formatter::operator()<>
            ((Formatter *)local_50,
             "\nif (stream->IsSerializationDeterministic() &&\n    this->_internal_$name$().size() > 1) {\n  ::std::unique_ptr<SortItem[]> items(\n      new SortItem[this->_internal_$name$().size()]);\n  typedef ::$proto_ns$::Map< $key_cpp$, $val_cpp$ >::size_type size_type;\n  size_type n = 0;\n  for (::$proto_ns$::Map< $key_cpp$, $val_cpp$ >::const_iterator\n      it = this->_internal_$name$().begin();\n      it != this->_internal_$name$().end(); ++it, ++n) {\n    items[static_cast<ptrdiff_t>(n)] = SortItem(&*it);\n  }\n  ::std::sort(&items[0], &items[static_cast<ptrdiff_t>(n)], Less());\n"
            );
  Formatter::Indent((Formatter *)local_50);
  GenerateSerializationLoop((Formatter *)local_50,string_key_00,string_value_00,true);
  Formatter::Outdent((Formatter *)local_50);
  Formatter::operator()<>((Formatter *)local_50,"} else {\n");
  Formatter::Indent((Formatter *)local_50);
  GenerateSerializationLoop((Formatter *)local_50,string_key_00,string_value_00,false);
  Formatter::Outdent((Formatter *)local_50);
  Formatter::operator()<>((Formatter *)local_50,"}\n");
  Formatter::Outdent((Formatter *)local_50);
  Formatter::operator()<>((Formatter *)local_50,"}\n");
  Formatter::~Formatter((Formatter *)local_50);
  return;
}

Assistant:

void MapFieldGenerator::GenerateSerializeWithCachedSizesToArray(
    io::Printer* printer) const {
  Formatter format(printer, variables_);
  format("if (!this->_internal_$name$().empty()) {\n");
  format.Indent();
  const FieldDescriptor* key_field =
      descriptor_->message_type()->FindFieldByName("key");
  const FieldDescriptor* value_field =
      descriptor_->message_type()->FindFieldByName("value");
  const bool string_key = key_field->type() == FieldDescriptor::TYPE_STRING;
  const bool string_value = value_field->type() == FieldDescriptor::TYPE_STRING;

  format(
      "typedef ::$proto_ns$::Map< $key_cpp$, $val_cpp$ >::const_pointer\n"
      "    ConstPtr;\n");
  if (string_key) {
    format(
        "typedef ConstPtr SortItem;\n"
        "typedef ::$proto_ns$::internal::"
        "CompareByDerefFirst<SortItem> Less;\n");
  } else {
    format(
        "typedef ::$proto_ns$::internal::SortItem< $key_cpp$, ConstPtr > "
        "SortItem;\n"
        "typedef ::$proto_ns$::internal::CompareByFirstField<SortItem> "
        "Less;\n");
  }
  bool utf8_check = string_key || string_value;
  if (utf8_check) {
    format(
        "struct Utf8Check {\n"
        "  static void Check(ConstPtr p) {\n"
        // p may be unused when GetUtf8CheckMode evaluates to kNone,
        // thus disabling the validation.
        "    (void)p;\n");
    format.Indent();
    format.Indent();
    if (string_key) {
      GenerateUtf8CheckCodeForString(
          key_field, options_, false,
          "p->first.data(), static_cast<int>(p->first.length()),\n", format);
    }
    if (string_value) {
      GenerateUtf8CheckCodeForString(
          value_field, options_, false,
          "p->second.data(), static_cast<int>(p->second.length()),\n", format);
    }
    format.Outdent();
    format.Outdent();
    format(
        "  }\n"
        "};\n");
  }

  format(
      "\n"
      "if (stream->IsSerializationDeterministic() &&\n"
      "    this->_internal_$name$().size() > 1) {\n"
      "  ::std::unique_ptr<SortItem[]> items(\n"
      "      new SortItem[this->_internal_$name$().size()]);\n"
      "  typedef ::$proto_ns$::Map< $key_cpp$, $val_cpp$ >::size_type "
      "size_type;\n"
      "  size_type n = 0;\n"
      "  for (::$proto_ns$::Map< $key_cpp$, $val_cpp$ >::const_iterator\n"
      "      it = this->_internal_$name$().begin();\n"
      "      it != this->_internal_$name$().end(); ++it, ++n) {\n"
      "    items[static_cast<ptrdiff_t>(n)] = SortItem(&*it);\n"
      "  }\n"
      "  ::std::sort(&items[0], &items[static_cast<ptrdiff_t>(n)], Less());\n");
  format.Indent();
  GenerateSerializationLoop(format, string_key, string_value, true);
  format.Outdent();
  format("} else {\n");
  format.Indent();
  GenerateSerializationLoop(format, string_key, string_value, false);
  format.Outdent();
  format("}\n");
  format.Outdent();
  format("}\n");
}